

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_perobj.cpp
# Opt level: O2

void set_together_method_proc(Am_Object *cmdobj)

{
  Am_Object::operator=(cmdobj,cmdobj);
  std::operator<<((ostream *)&std::cout,"===== start ===== set together\n");
  Am_Object::Set(0x51a8,0x65,10);
  Am_Object::Set(0x51a8,100,10);
  std::operator<<((ostream *)&std::cout,"=====  end  ===== set together\n");
  std::ostream::flush();
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, set_together_method,
                 (Am_Object cmdobj))
{
  cmdobj = cmdobj;

  cout << "===== start ===== set together\n";
  rect.Set(Am_TOP, 10);
  rect.Set(Am_LEFT, 10);

  cout << "=====  end  ===== set together\n" << flush;
}